

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

String * kj::_::anon_unknown_0::anon_unknown_8::LocalizeRadix
                   (String *__return_storage_ptr__,char *input,char *radix_pos)

{
  bool bVar1;
  StringPtr *in_R8;
  ArrayPtr<char> local_140;
  ArrayPtr<char> local_130;
  ArrayPtr<const_char> local_120;
  Fault local_110;
  Fault f_2;
  int *local_100;
  undefined1 local_f8 [8];
  DebugComparison<int_&,_int> _kjCondition_2;
  Fault f_1;
  char *local_c0;
  undefined1 local_b8 [8];
  DebugComparison<char_&,_char> _kjCondition_1;
  Fault local_80;
  Fault f;
  char *local_70;
  undefined1 local_68 [8];
  DebugComparison<char_&,_char> _kjCondition;
  char local_38 [4];
  int size;
  char temp [16];
  char *radix_pos_local;
  char *input_local;
  
  memset(local_38,0,0x10);
  _kjCondition._36_4_ = snprintf(local_38,0x10,"%.1f",0x3ff8000000000000);
  local_70 = (char *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,local_38);
  f.exception._7_1_ = 0x31;
  DebugExpression<char&>::operator==
            ((DebugComparison<char_&,_char> *)local_68,(DebugExpression<char&> *)&local_70,
             (char *)((long)&f.exception + 7));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x20f,FAILED,"temp[0] == \'1\'","_kjCondition,",
               (DebugComparison<char_&,_char> *)local_68);
    Debug::Fault::fatal(&local_80);
  }
  local_c0 = (char *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                                local_38 + (_kjCondition._36_4_ + -1));
  f_1.exception._7_1_ = 0x35;
  DebugExpression<char&>::operator==
            ((DebugComparison<char_&,_char> *)local_b8,(DebugExpression<char&> *)&local_c0,
             (char *)((long)&f_1.exception + 7));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&>
              ((Fault *)&_kjCondition_2.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x210,FAILED,"temp[size-1] == \'5\'","_kjCondition,",
               (DebugComparison<char_&,_char> *)local_b8);
    Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
  }
  local_100 = (int *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                                (int *)&_kjCondition.field_0x24);
  f_2.exception._4_4_ = 6;
  DebugExpression<int&>::operator<=
            ((DebugComparison<int_&,_int> *)local_f8,(DebugExpression<int&> *)&local_100,
             (int *)((long)&f_2.exception + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x211,FAILED,"size <= 6","_kjCondition,",(DebugComparison<int_&,_int> *)local_f8);
    Debug::Fault::fatal(&local_110);
  }
  local_120 = arrayPtr<char_const>(input,radix_pos);
  local_130 = arrayPtr<char>(local_38 + 1,(long)(_kjCondition._36_4_ + -2));
  StringPtr::StringPtr((StringPtr *)&local_140,radix_pos + 1);
  str<kj::ArrayPtr<char_const>,kj::ArrayPtr<char>,kj::StringPtr>
            (__return_storage_ptr__,(kj *)&local_120,(ArrayPtr<const_char> *)&local_130,&local_140,
             in_R8);
  return __return_storage_ptr__;
}

Assistant:

kj::String LocalizeRadix(const char* input, const char* radix_pos) {
  // Determine the locale-specific radix character by calling sprintf() to
  // print the number 1.5, then stripping off the digits.  As far as I can
  // tell, this is the only portable, thread-safe way to get the C library
  // to divuldge the locale's radix character.  No, localeconv() is NOT
  // thread-safe.
  char temp[16]{};
  int size = snprintf(temp, sizeof(temp), "%.1f", 1.5);
  KJ_ASSERT(temp[0] == '1');
  KJ_ASSERT(temp[size-1] == '5');
  KJ_ASSERT(size <= 6);

  // Now replace the '.' in the input with it.
  return kj::str(
      kj::arrayPtr(input, radix_pos),
      kj::arrayPtr(temp + 1, size - 2),
      kj::StringPtr(radix_pos + 1));
}